

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloat.hpp
# Opt level: O1

Float<unsigned_int,_8,_23,_127,_3U>
tcu::Float<unsigned_int,8,23,127,3u>::convert<unsigned_long,11,52,1023,3u>
          (Float<unsigned_long,_11,_52,_1023,_3U> *other)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  StorageType SVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  uVar1 = other->m_value;
  if ((uVar1 & 0x7fffffffffffffff) == 0x7ff0000000000000) {
LAB_0110864e:
    return (Float<unsigned_int,_8,_23,_127,_3U>)((uint)(-1 < (long)uVar1) * -0x80000000 - 0x800000);
  }
  uVar5 = uVar1 & 0xfffffffffffff;
  SVar4 = 0x7fffffff;
  if (((uVar1 & 0x7ff0000000000000) != 0x7ff0000000000000 || uVar5 == 0) &&
     (SVar4 = (StorageType)(uVar1 >> 0x20), (uVar1 & 0x7fffffffffffffff) != 0)) {
    iVar7 = (SVar4 >> 0x14 & 0x7ff) - 0x3ff;
    uVar6 = uVar5 | 0x10000000000000;
    if ((uVar1 & 0x7ff0000000000000) == 0 && uVar5 != 0) {
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      uVar6 = uVar5 << (~(byte)lVar2 + 0x35 & 0x3f);
      iVar7 = -0x3f3 - ((uint)lVar2 ^ 0x3f);
    }
    if (iVar7 < -0x7e) {
      if (-0x97 < iVar7) {
        return (Float<unsigned_int,_8,_23,_127,_3U>)
               (SVar4 & 0x80000000 |
               (uint)(~(-1L << (0x9eU - (char)iVar7 & 0x3f)) + uVar6 +
                      (ulong)((uVar6 >> ((ulong)(-iVar7 - 0x61U) & 0x3f) & 1) != 0) >>
                     ((byte)(-iVar7 - 0x61U) & 0x3f)));
      }
      return (Float<unsigned_int,_8,_23,_127,_3U>)(SVar4 & 0x80000000);
    }
    uVar5 = (uVar6 & 0xffefffffffffffff) + 0xfffffff + (ulong)(((uint)uVar6 >> 0x1d & 1) != 0);
    uVar6 = uVar5 & 0x10000000000000;
    iVar7 = iVar7 + (uint)(uVar6 >> 0x34);
    if (0x7f < iVar7) goto LAB_0110864e;
    uVar3 = (uint)(uVar5 >> 0x1d);
    if (uVar6 != 0) {
      uVar3 = 0;
    }
    SVar4 = uVar3 | SVar4 & 0x80000000 | iVar7 * 0x800000 + 0x3f800000U;
  }
  return (Float<unsigned_int,_8,_23,_127,_3U>)SVar4;
}

Assistant:

Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>
Float<StorageType, ExponentBits, MantissaBits, ExponentBias, Flags>::convert
	(const Float<OtherStorageType, OtherExponentBits, OtherMantissaBits, OtherExponentBias, OtherFlags>& other)
{
	if (!(Flags & FLOAT_HAS_SIGN) && other.sign() < 0)
	{
		// Negative number, truncate to zero.
		return zero(+1);
	}
	else if (other.isInf())
	{
		return inf(other.sign());
	}
	else if (other.isNaN())
	{
		return nan();
	}
	else if (other.isZero())
	{
		return zero(other.sign());
	}
	else
	{
		const int			eMin	= 1 - ExponentBias;
		const int			eMax	= ((1<<ExponentBits)-2) - ExponentBias;

		const StorageType	s		= StorageType((StorageType(other.signBit())) << (StorageType(ExponentBits+MantissaBits))); // \note Not sign, but sign bit.
		int					e		= other.exponent();
		deUint64			m		= other.mantissa();

		// Normalize denormalized values prior to conversion.
		while (!(m & (1ull<<OtherMantissaBits)))
		{
			m <<= 1;
			e  -= 1;
		}

		if (e < eMin)
		{
			// Underflow.
			if ((Flags & FLOAT_SUPPORT_DENORM) && (eMin-e-1 <= MantissaBits))
			{
				// Shift and round (RTE).
				int			bitDiff	= (OtherMantissaBits-MantissaBits) + (eMin-e);
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				return Float(StorageType(s | (m + half + bias) >> bitDiff));
			}
			else
				return zero(other.sign());
		}
		else
		{
			// Remove leading 1.
			m = m & ~(1ull<<OtherMantissaBits);

			if (MantissaBits < OtherMantissaBits)
			{
				// Round mantissa (round to nearest even).
				int			bitDiff	= OtherMantissaBits-MantissaBits;
				deUint64	half	= (1ull << (bitDiff - 1)) - 1;
				deUint64	bias	= (m >> bitDiff) & 1;

				m = (m + half + bias) >> bitDiff;

				if (m & (1ull<<MantissaBits))
				{
					// Overflow in mantissa.
					m  = 0;
					e += 1;
				}
			}
			else
			{
				int bitDiff = MantissaBits-OtherMantissaBits;
				m = m << bitDiff;
			}

			if (e > eMax)
			{
				// Overflow.
				return inf(other.sign());
			}
			else
			{
				DE_ASSERT(de::inRange(e, eMin, eMax));
				DE_ASSERT(((e + ExponentBias) & ~((1ull<<ExponentBits)-1)) == 0);
				DE_ASSERT((m & ~((1ull<<MantissaBits)-1)) == 0);

				return Float(StorageType(s | (StorageType(e + ExponentBias) << MantissaBits) | m));
			}
		}
	}
}